

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O0

fdb_status
fdb_switch_compaction_mode(fdb_file_handle *fhandle,fdb_compaction_mode_t mode,size_t new_threshold)

{
  bool bVar1;
  fdb_status fVar2;
  int iVar3;
  size_t sVar4;
  ulong in_RDX;
  char in_SIL;
  long *in_RDI;
  char metafile [1024];
  char filename [1024];
  char vfilename [1024];
  fdb_config config;
  fdb_kvs_handle *handle;
  fdb_status fs;
  int ret;
  fdb_config *in_stack_00000f60;
  fdb_filename_mode_t in_stack_00000f6c;
  char *in_stack_00000f70;
  fdb_kvs_handle *in_stack_00000f78;
  char acStack_d28 [8];
  filemgr *in_stack_fffffffffffff2e0;
  fdb_kvs_handle *in_stack_fffffffffffff2e8;
  char *in_stack_fffffffffffff2f8;
  char *in_stack_fffffffffffff300;
  char local_928 [335];
  undefined1 in_stack_fffffffffffff827;
  filemgr *in_stack_fffffffffffff828;
  filemgr *in_stack_fffffffffffff830;
  char local_528 [1024];
  undefined1 local_128 [46];
  undefined1 local_fa;
  undefined1 local_f9;
  long local_30;
  fdb_status local_28;
  uint local_24;
  ulong local_20;
  char local_11;
  fdb_status local_4;
  
  if ((in_RDI == (long *)0x0) || (*in_RDI == 0)) {
    local_4 = FDB_RESULT_INVALID_HANDLE;
  }
  else {
    local_30 = *in_RDI;
    if (in_RDX < 0x65) {
      local_20 = in_RDX;
      local_11 = in_SIL;
      memcpy(local_128,(void *)(local_30 + 0x70),0xf8);
      if (*(char *)(local_30 + 0x9e) == local_11) {
        if (*(char *)(local_30 + 0x9e) == '\x01') {
          compactor_change_threshold(in_stack_fffffffffffff830,(size_t)in_stack_fffffffffffff828);
        }
      }
      else {
        sVar4 = filemgr_get_ref_count(in_stack_fffffffffffff2e0);
        if (1 < sVar4) {
          return FDB_RESULT_FILE_IS_BUSY;
        }
        if (*(char *)(local_30 + 0x9e) == '\x01') {
          bVar1 = compactor_switch_compaction_flag
                            (in_stack_fffffffffffff828,(bool)in_stack_fffffffffffff827);
          if (!bVar1) {
            return FDB_RESULT_FILE_IS_BUSY;
          }
          strcpy(local_528,*(char **)(local_30 + 0x1c0));
          strcpy(local_928,(char *)**(undefined8 **)(local_30 + 0x48));
          local_28 = _fdb_close(in_stack_fffffffffffff2e8);
          if (local_28 != FDB_RESULT_SUCCESS) {
            return local_28;
          }
          sprintf(acStack_d28,"%s.meta",local_528);
          local_24 = remove(acStack_d28);
          if ((int)local_24 < 0) {
            return FDB_RESULT_FILE_REMOVE_FAIL;
          }
          local_24 = rename(local_928,local_528);
          if ((int)local_24 < 0) {
            return FDB_RESULT_FILE_RENAME_FAIL;
          }
          local_fa = 0;
          fVar2 = _fdb_open(in_stack_00000f78,in_stack_00000f70,in_stack_00000f6c,in_stack_00000f60)
          ;
        }
        else {
          if (*(char *)(local_30 + 0x9e) != '\0') {
            return FDB_RESULT_INVALID_ARGS;
          }
          strcpy(local_528,(char *)**(undefined8 **)(local_30 + 0x48));
          compactor_get_next_filename(in_stack_fffffffffffff300,in_stack_fffffffffffff2f8);
          local_28 = _fdb_close(in_stack_fffffffffffff2e8);
          if (local_28 != FDB_RESULT_SUCCESS) {
            return local_28;
          }
          iVar3 = rename(local_528,local_928);
          local_24 = (uint)(iVar3 < 0);
          if (iVar3 < 0) {
            return FDB_RESULT_FILE_RENAME_FAIL;
          }
          local_fa = 1;
          local_f9 = (undefined1)local_20;
          fVar2 = _fdb_open(in_stack_00000f78,in_stack_00000f70,in_stack_00000f6c,in_stack_00000f60)
          ;
        }
        if (fVar2 != FDB_RESULT_SUCCESS) {
          return fVar2;
        }
      }
      local_4 = FDB_RESULT_SUCCESS;
    }
    else {
      local_4 = FDB_RESULT_INVALID_ARGS;
    }
  }
  return local_4;
}

Assistant:

LIBFDB_API
fdb_status fdb_switch_compaction_mode(fdb_file_handle *fhandle,
                                      fdb_compaction_mode_t mode,
                                      size_t new_threshold)
{
    if (!fhandle || !fhandle->root) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    int ret;
    fdb_status fs;
    fdb_kvs_handle *handle = fhandle->root;
    fdb_config config;
    char vfilename[FDB_MAX_FILENAME_LEN];
    char filename[FDB_MAX_FILENAME_LEN];
    char metafile[FDB_MAX_FILENAME_LEN];

    if (new_threshold > 100) {
        return FDB_RESULT_INVALID_ARGS;
    }

    config = handle->config;
    if (handle->config.compaction_mode != mode) {
        if (filemgr_get_ref_count(handle->file) > 1) {
            // all the other handles referring this file should be closed
            return FDB_RESULT_FILE_IS_BUSY;
        }
        /* TODO: In current code, we assume that all the other handles referring
         * the same database file should be closed before calling this API and
         * any open API calls should not be made until the completion of this API.
         */

        if (handle->config.compaction_mode == FDB_COMPACTION_AUTO) {
            // 1. deregister from compactor (by calling fdb_close)
            // 2. remove [filename].meta
            // 3. rename [filename].[n] as [filename]

            // set compaction flag to avoid auto compaction.
            // we will not clear this flag again becuase this file will be
            // deregistered by calling _fdb_close().
            if (compactor_switch_compaction_flag(handle->file, true) == false) {
                return FDB_RESULT_FILE_IS_BUSY;
            }

            strcpy(vfilename, handle->filename);
            strcpy(filename, handle->file->filename);
            fs = _fdb_close(handle);
            if (fs != FDB_RESULT_SUCCESS) {
                return fs;
            }
            sprintf(metafile, "%s.meta", vfilename);
            if ((ret = remove(metafile)) < 0) {
                return FDB_RESULT_FILE_REMOVE_FAIL;
            }
            if ((ret = rename(filename, vfilename)) < 0) {
                return FDB_RESULT_FILE_RENAME_FAIL;
            }
            config.compaction_mode = FDB_COMPACTION_MANUAL;
            fs = _fdb_open(handle, vfilename, FDB_VFILENAME, &config);
            if (fs != FDB_RESULT_SUCCESS) {
                return fs;
            }
        } else if (handle->config.compaction_mode == FDB_COMPACTION_MANUAL) {
            // 1. rename [filename] as [filename].rev_num
            strcpy(vfilename, handle->file->filename);
            compactor_get_next_filename(handle->file->filename, filename);
            fs = _fdb_close(handle);
            if (fs != FDB_RESULT_SUCCESS) {
                return fs;
            }
            if ((ret = rename(vfilename, filename) < 0)) {
                return FDB_RESULT_FILE_RENAME_FAIL;
            }
            config.compaction_mode = FDB_COMPACTION_AUTO;
            config.compaction_threshold = new_threshold;
            fs = _fdb_open(handle, vfilename, FDB_VFILENAME, &config);
            if (fs != FDB_RESULT_SUCCESS) {
                return fs;
            }

        } else {
            return FDB_RESULT_INVALID_ARGS;
        }
    } else {
        if (handle->config.compaction_mode == FDB_COMPACTION_AUTO) {
            // change compaction threshold of the existing file
            compactor_change_threshold(handle->file, new_threshold);
        }
    }
    return FDB_RESULT_SUCCESS;
}